

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  int iVar8;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar9;
  ImGuiTableSettings *p;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  
  pcVar4 = (ctx->SettingsTables).Buf.Data;
  p = (ImGuiTableSettings *)(pcVar4 + 4);
  if (pcVar4 == (char *)0x0) {
    p = (ImGuiTableSettings *)0x0;
  }
  do {
    if (p == (ImGuiTableSettings *)0x0) {
      return;
    }
    if (p->ID != 0) {
      uVar2 = p->SaveFlags;
      uVar12 = -(uint)((uVar2 & 0xf) == 0);
      if ((uVar12 & 1) == 0) {
        iVar3 = (buf->Buf).Size;
        iVar8 = iVar3 + -1;
        if (iVar3 == 0) {
          iVar8 = 0;
        }
        ImVector<char>::reserve(&buf->Buf,iVar8 + p->ColumnsCount * 0x32 + 0x1e);
        ImGuiTextBuffer::appendf
                  (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)p->ID,
                   (ulong)(uint)(int)p->ColumnsCount);
        fVar1 = p->RefScale;
        if ((fVar1 != 0.0) || (uVar9 = extraout_EAX, NAN(fVar1))) {
          ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
          uVar9 = extraout_EAX_00;
        }
        auVar6._4_4_ = -(uint)((uVar2 & 8) == 0);
        auVar6._0_4_ = uVar12;
        auVar6._8_4_ = -(uint)((uVar2 & 2) == 0);
        auVar6._12_4_ = -(uint)((uVar2 & 4) == 0);
        uVar12 = movmskps(uVar9,auVar6);
        pbVar10 = (byte *)((long)&p[1].RefScale + 3);
        for (uVar11 = 0; (int)uVar11 < (int)p->ColumnsCount; uVar11 = (ulong)((int)uVar11 + 1)) {
          if ((*(int *)(pbVar10 + -7) == 0 && (uVar2 & 7) == 0) && (uVar12 & 2) == 0) {
            if (pbVar10[-1] != 0xff) goto LAB_001894f6;
          }
          else if (*(int *)(pbVar10 + -7) != 0 || (uVar2 & 7) != 0) {
LAB_001894f6:
            ImGuiTextBuffer::appendf(buf,"Column %-2d",uVar11);
            if (*(int *)(pbVar10 + -7) != 0) {
              ImGuiTextBuffer::appendf(buf," UserID=%08X");
            }
            if ((uVar2 & 1) != 0) {
              bVar7 = *pbVar10;
              if ((bVar7 & 8) != 0) {
                ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar10 + -0xb));
                bVar7 = *pbVar10;
              }
              if ((bVar7 & 8) == 0) {
                ImGuiTextBuffer::appendf
                          (buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar10 + -0xb));
              }
            }
            if ((byte)((byte)uVar12 >> 3) == 0) {
              ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar10 >> 2 & 1));
            }
            if ((uVar12 & 4) == 0) {
              ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar10[-2]);
            }
            if (((uVar12 & 2) == 0) && ((int)(char)pbVar10[-1] != 0xffffffff)) {
              uVar5 = 0x5e;
              if ((*pbVar10 & 3) == 1) {
                uVar5 = 0x76;
              }
              ImGuiTextBuffer::appendf(buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar10[-1],uVar5);
            }
            ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
          }
          pbVar10 = pbVar10 + 0xc;
        }
        ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      }
    }
    p = ImChunkStream<ImGuiTableSettings>::next_chunk(&ctx->SettingsTables,p);
  } while( true );
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            bool save_column = column->UserID != 0 || save_size || save_visible || save_order || (save_sort && column->SortOrder != -1);
            if (!save_column)
                continue;
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}